

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

iterator * __thiscall Catch::TextFlow::Column::iterator::operator++(iterator *this)

{
  Column *this_00;
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  bool local_29;
  string *current_line;
  iterator *this_local;
  
  this->m_pos = this->m_len + this->m_pos;
  this_00 = this->m_column;
  uVar1 = this->m_pos;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this_00->m_string);
  if ((uVar1 < sVar2) &&
     (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](&this_00->m_string,this->m_pos), *pvVar3 == '\n')) {
    this->m_pos = this->m_pos + 1;
  }
  else {
    while( true ) {
      uVar1 = this->m_pos;
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&this_00->m_string);
      local_29 = false;
      if (uVar1 < sVar2) {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](&this_00->m_string,this->m_pos);
        local_29 = anon_unknown.dwarf_b9097::isWhitespace(*pvVar3);
      }
      if (local_29 == false) break;
      this->m_pos = this->m_pos + 1;
    }
  }
  sVar2 = this->m_pos;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this_00->m_string);
  if (sVar2 != sVar4) {
    calcLength(this);
  }
  return this;
}

Assistant:

Column::iterator &Column::iterator::operator++() {
            m_pos += m_len;
            std::string const &current_line = m_column.m_string;
            if (m_pos < current_line.size() && current_line[m_pos] == '\n') {
                m_pos += 1;
            }
            else {
                while (m_pos < current_line.size() &&
                    isWhitespace(current_line[m_pos])) {
                    ++m_pos;
                }
            }

            if (m_pos != current_line.size()) {
                calcLength();
            }
            return *this;
        }